

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_private.c
# Opt level: O2

zt_log_ty * zt_log_new(zt_log_vtbl_ty *vptr,uint opts)

{
  zt_log_ty *pzVar1;
  
  pzVar1 = (zt_log_ty *)zt_calloc_p(1,vptr->size);
  if (pzVar1 != (zt_log_ty *)0x0) {
    pzVar1->vtbl = vptr;
    pzVar1->opts = opts;
    pzVar1->level = zt_log_max;
    return pzVar1;
  }
  fwrite("Unable to calloc memory for log vtable\n",0x27,1,_stderr);
  exit(1);
}

Assistant:

zt_log_ty *
zt_log_new(zt_log_vtbl_ty * vptr, unsigned int opts) {
    zt_log_ty * result;

    result        = zt_callocs(vptr->size, 1);
    if (!result) {
        fprintf(stderr, "Unable to calloc memory for log vtable\n");
        exit(1);
    }
    result->vtbl  = vptr;
    result->opts  = opts;
    result->level = zt_log_max;

    return result;
}